

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeView::doItemsLayout(QTreeView *this)

{
  QTreeViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  char cVar2;
  long in_FS_OFFSET;
  piter local_48;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if (this_00->hasRemovedItems == true) {
    this_00->hasRemovedItems = false;
    local_48 = (piter)QHash<QPersistentModelIndex,_QHashDummyValue>::begin
                                (&(this_00->expandedIndexes).q_hash);
    while ((local_48.d != (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0
           || (local_48.bucket != 0))) {
      cVar2 = QPersistentModelIndex::isValid();
      if (cVar2 == '\0') {
        local_48 = (piter)QHash<QPersistentModelIndex,_QHashDummyValue>::erase
                                    (&(this_00->expandedIndexes).q_hash,(const_iterator)local_48);
      }
      else {
        QHashPrivate::iterator<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
        operator++(&local_48);
      }
    }
    local_48 = (piter)QHash<QPersistentModelIndex,_QHashDummyValue>::begin
                                (&(this_00->hiddenIndexes).q_hash);
    while ((local_48.d != (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0
           || (local_48.bucket != 0))) {
      cVar2 = QPersistentModelIndex::isValid();
      if (cVar2 == '\0') {
        local_48 = (piter)QHash<QPersistentModelIndex,_QHashDummyValue>::erase
                                    (&(this_00->hiddenIndexes).q_hash,(const_iterator)local_48);
      }
      else {
        QHashPrivate::iterator<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
        operator++(&local_48);
      }
    }
  }
  QList<QTreeViewItem>::clear(&this_00->viewItems);
  local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)
               &DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QModelIndex *)&local_48,&(this_00->super_QAbstractItemViewPrivate).root);
  pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
  cVar2 = (**(code **)(*(long *)pQVar1 + 0x88))(pQVar1,&local_48);
  if (cVar2 != '\0') {
    QTreeViewPrivate::layout(this_00,-1,false,false);
  }
  QAbstractItemView::doItemsLayout((QAbstractItemView *)this);
  (**(code **)(*(long *)&(this_00->header->super_QAbstractItemView).super_QAbstractScrollArea.
                         super_QFrame.super_QWidget + 0x220))();
  QTreeViewPrivate::updateAccessibility(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::doItemsLayout()
{
    Q_D(QTreeView);
    if (d->hasRemovedItems) {
        //clean the QSet that may contains old (and this invalid) indexes
        d->hasRemovedItems = false;
        QSet<QPersistentModelIndex>::iterator it = d->expandedIndexes.begin();
        while (it != d->expandedIndexes.end()) {
            if (!it->isValid())
                it = d->expandedIndexes.erase(it);
            else
                ++it;
        }
        it = d->hiddenIndexes.begin();
        while (it != d->hiddenIndexes.end()) {
            if (!it->isValid())
                it = d->hiddenIndexes.erase(it);
            else
                ++it;
        }
    }
    d->viewItems.clear(); // prepare for new layout
    QModelIndex parent = d->root;
    if (d->model->hasChildren(parent)) {
        d->layout(-1);
    }
    QAbstractItemView::doItemsLayout();
    d->header->doItemsLayout();
    d->updateAccessibility();
}